

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

StringRef llvm::dwarf::GDBIndexEntryKindString(GDBIndexEntryKind Kind)

{
  StringRef SVar1;
  
  if (Kind < 8) {
    SVar1.Data = &DAT_00e6fd70 + *(int *)(&DAT_00e6fd70 + (ulong)Kind * 4);
    SVar1.Length = *(size_t *)(&DAT_00e6fd30 + (ulong)Kind * 8);
    return SVar1;
  }
  llvm_unreachable_internal
            ("Unknown GDBIndexEntryKind value",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/Dwarf.cpp"
             ,0x24f);
}

Assistant:

StringRef llvm::dwarf::GDBIndexEntryKindString(GDBIndexEntryKind Kind) {
  switch (Kind) {
  case GIEK_NONE:
    return "NONE";
  case GIEK_TYPE:
    return "TYPE";
  case GIEK_VARIABLE:
    return "VARIABLE";
  case GIEK_FUNCTION:
    return "FUNCTION";
  case GIEK_OTHER:
    return "OTHER";
  case GIEK_UNUSED5:
    return "UNUSED5";
  case GIEK_UNUSED6:
    return "UNUSED6";
  case GIEK_UNUSED7:
    return "UNUSED7";
  }
  llvm_unreachable("Unknown GDBIndexEntryKind value");
}